

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# numeric.h
# Opt level: O0

iter_type __thiscall
booster::locale::util::base_num_parse<char>::do_real_get<double>
          (base_num_parse<char> *this,iter_type in,iter_type end,ios_base *ios,iostate *err,
          double *val)

{
  long lVar1;
  iter_type end_00;
  iter_type in_00;
  iter_type in_01;
  fmtflags __fmtfl;
  _Ios_Iostate _Var2;
  uint64_t uVar3;
  streamsize __prec;
  undefined8 in_RCX;
  undefined4 in_EDX;
  undefined8 in_RSI;
  undefined8 in_RDI;
  undefined4 in_R8D;
  ios_base *in_R9;
  iter_type iVar4;
  iter_type iVar5;
  _Ios_Iostate *in_stack_00000008;
  double *in_stack_00000010;
  longdouble ret_val;
  stringstream ss;
  ios_info *info;
  ios_base *in_stack_fffffffffffffd80;
  base_num_parse<char> *in_stack_fffffffffffffd88;
  undefined4 in_stack_fffffffffffffd90;
  undefined4 in_stack_fffffffffffffd94;
  undefined8 in_stack_fffffffffffffd98;
  undefined4 in_stack_fffffffffffffda0;
  undefined4 in_stack_fffffffffffffda4;
  undefined8 in_stack_fffffffffffffda8;
  undefined4 in_stack_fffffffffffffdd0;
  undefined4 in_stack_fffffffffffffdd4;
  longdouble lVar6;
  locale local_1d8;
  long local_1d0 [49];
  ios_info *local_48;
  ios_base *local_40;
  undefined8 local_30;
  undefined4 uStack_28;
  streambuf_type *local_20;
  int_type iStack_18;
  undefined4 uStack_14;
  undefined1 local_10 [12];
  
  local_40 = in_R9;
  local_30 = in_RCX;
  uStack_28 = in_R8D;
  local_20 = (streambuf_type *)in_RSI;
  iStack_18 = in_EDX;
  local_48 = ios_info::get((ios_base *)0x295c80);
  uVar3 = ios_info::display_flags(local_48);
  switch(uVar3) {
  case 0:
    std::__cxx11::stringstream::stringstream((stringstream *)local_1d0);
    std::locale::classic();
    std::ios::imbue(&local_1d8);
    std::locale::~locale(&local_1d8);
    lVar1 = *(long *)(local_1d0[0] + -0x18);
    __fmtfl = std::ios_base::flags(local_40);
    std::ios_base::flags((ios_base *)((long)local_1d0 + lVar1),__fmtfl);
    lVar1 = *(long *)(local_1d0[0] + -0x18);
    __prec = std::ios_base::precision(local_40);
    std::ios_base::precision((ios_base *)((long)local_1d0 + lVar1),__prec);
    local_10 = std::num_get<char,std::istreambuf_iterator<char,std::char_traits<char>>>::do_get
                         (in_RDI,local_20,iStack_18,local_30,uStack_28,
                          (long)local_1d0 + *(long *)(local_1d0[0] + -0x18),in_stack_00000008,
                          in_stack_00000010);
    std::__cxx11::stringstream::~stringstream((stringstream *)local_1d0);
    break;
  case 1:
  case 3:
  case 4:
  case 5:
  case 6:
  case 7:
  case 8:
  case 9:
  default:
    local_10 = std::num_get<char,std::istreambuf_iterator<char,std::char_traits<char>>>::do_get
                         (in_RDI,local_20,iStack_18,local_30,uStack_28,local_40,in_stack_00000008,
                          in_stack_00000010);
    break;
  case 2:
    lVar6 = (longdouble)0;
    uVar3 = ios_info::currency_flags(local_48);
    if ((uVar3 == 0) || (uVar3 = ios_info::currency_flags(local_48), uVar3 == 0x40)) {
      in_00._M_sbuf._4_4_ = in_stack_fffffffffffffda4;
      in_00._M_sbuf._0_4_ = in_stack_fffffffffffffda0;
      in_00._8_8_ = local_30;
      iVar4._M_sbuf._4_4_ = in_stack_fffffffffffffd94;
      iVar4._M_sbuf._0_4_ = in_stack_fffffffffffffd90;
      iVar4._8_8_ = in_stack_fffffffffffffd98;
      iVar4 = parse_currency<false>
                        (in_stack_fffffffffffffd88,in_00,iVar4,in_stack_fffffffffffffd80,
                         (iostate *)CONCAT44(in_stack_fffffffffffffdd4,in_stack_fffffffffffffdd0),
                         SUB108(lVar6,0));
      local_20 = iVar4._M_sbuf;
      iStack_18 = iVar4._M_c;
    }
    else {
      in_01._M_sbuf._4_4_ = in_stack_fffffffffffffda4;
      in_01._M_sbuf._0_4_ = in_stack_fffffffffffffda0;
      in_01._8_8_ = in_stack_fffffffffffffda8;
      end_00._M_sbuf._4_4_ = in_stack_fffffffffffffd94;
      end_00._M_sbuf._0_4_ = in_stack_fffffffffffffd90;
      end_00._8_8_ = in_stack_fffffffffffffd98;
      iVar4 = parse_currency<true>
                        (in_stack_fffffffffffffd88,in_01,end_00,
                         (ios_base *)CONCAT44(uStack_14,iStack_18),
                         (iostate *)CONCAT44(in_stack_fffffffffffffdd4,in_stack_fffffffffffffdd0),
                         SUB108(lVar6,0));
      local_20 = iVar4._M_sbuf;
      iStack_18 = iVar4._M_c;
    }
    _Var2 = std::operator&(*in_stack_00000008,_S_failbit);
    if (_Var2 == _S_goodbit) {
      *in_stack_00000010 = (double)lVar6;
    }
    local_10._8_4_ = iStack_18;
    local_10._0_8_ = local_20;
  }
  iVar5._12_4_ = 0;
  iVar5._M_sbuf = (streambuf_type *)local_10._0_8_;
  iVar5._M_c = local_10._8_4_;
  return iVar5;
}

Assistant:

iter_type do_real_get(iter_type in,iter_type end,std::ios_base &ios,std::ios_base::iostate &err,ValueType &val) const
    {
        typedef std::num_get<char_type> super;

        ios_info &info=ios_info::get(ios);

        switch(info.display_flags()) {
        case flags::posix:
            {
                std::stringstream ss;
                ss.imbue(std::locale::classic());
                ss.flags(ios.flags());
                ss.precision(ios.precision());
                return super::do_get(in,end,ss,err,val);
            }
        case flags::currency:
            {
                long double ret_val = 0;
                if(info.currency_flags()==flags::currency_default || info.currency_flags() == flags::currency_national)
                    in = parse_currency<false>(in,end,ios,err,ret_val);
                else
                    in = parse_currency<true>(in,end,ios,err,ret_val);
                if(!(err & std::ios_base::failbit))
                    val = static_cast<ValueType>(ret_val);
                return in;
            }

        // date-time parsing is not supported
        // due to buggy standard
        case flags::date:
        case flags::time:
        case flags::datetime:
        case flags::strftime:

        case flags::number:
        case flags::percent:
        case flags::spellout:
        case flags::ordinal:
        default:
            return super::do_get(in,end,ios,err,val);
        }
    }